

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall QLocale::toString(QLocale *this,QTime time,FormatType format)

{
  bool bVar1;
  QLocalePrivate *pQVar2;
  QSystemLocale *pQVar3;
  int in_ECX;
  undefined8 in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString format_str;
  QVariant res;
  QVariant *in_stack_ffffffffffffff18;
  QVariant *in_stack_ffffffffffffff20;
  QVariant *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  QLocale *in_stack_ffffffffffffff48;
  FormatType format_00;
  undefined4 in_stack_ffffffffffffff68;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff6c;
  QTime local_4c;
  QLocale local_48 [4];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  format_00 = (FormatType)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QTime::isValid(&local_4c);
  if (bVar1) {
    pQVar2 = QSharedDataPointer<QLocalePrivate>::operator->
                       ((QSharedDataPointer<QLocalePrivate> *)0x4cee62);
    if (pQVar2->m_data == &systemLocaleData) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = systemLocale();
      in_stack_ffffffffffffff44 = 0x14 - (in_ECX == 0);
      in_stack_ffffffffffffff48 = local_48;
      ::QVariant::QVariant
                (in_stack_ffffffffffffff20,(QTime)(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      (*pQVar3->_vptr_QSystemLocale[2])
                (&local_28,pQVar3,(ulong)in_stack_ffffffffffffff44,in_stack_ffffffffffffff48);
      ::QVariant::~QVariant(in_stack_ffffffffffffff20);
      bVar1 = ::QVariant::isNull(in_stack_ffffffffffffff28);
      if (!bVar1) {
        ::QVariant::toString(in_stack_ffffffffffffff18);
      }
      uVar4 = (uint)!bVar1;
      ::QVariant::~QVariant(in_stack_ffffffffffffff20);
      if (uVar4 != 0) goto LAB_004cf044;
      in_stack_ffffffffffffff68 = 0;
    }
    timeFormat((QLocale *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),format_00);
    toString(in_stack_ffffffffffffff48,(QTime)(int)((ulong)in_RDI >> 0x20),
             (QString *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    QString::~QString((QString *)0x4cf021);
  }
  else {
    QString::QString((QString *)0x4cee53);
  }
LAB_004cf044:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocale::toString(QTime time, FormatType format) const
{
    if (!time.isValid())
        return QString();

#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        QVariant res = systemLocale()->query(format == LongFormat
                                             ? QSystemLocale::TimeToStringLong
                                             : QSystemLocale::TimeToStringShort,
                                             time);
        if (!res.isNull())
            return res.toString();
    }
#endif

    QString format_str = timeFormat(format);
    return toString(time, format_str);
}